

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O2

void __thiscall subprocess::detail::Streams::setup_comm_channels(Streams *this)

{
  FILE *pFVar1;
  long lVar2;
  long in_FS_OFFSET;
  element_type *local_30 [3];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->write_to_child_ != -1) {
    pFVar1 = fdopen(this->write_to_child_,"wb");
    input(this,(FILE *)pFVar1);
  }
  if (this->read_from_child_ != -1) {
    pFVar1 = fdopen(this->read_from_child_,"rb");
    output(this,(FILE *)pFVar1);
  }
  if (this->err_read_ != -1) {
    pFVar1 = fdopen(this->err_read_,"rb");
    error(this,(FILE *)pFVar1);
  }
  local_30[0] = (this->input_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_30[1] = (this->output_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_30[2] = (this->error_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 8) {
    if (*(FILE **)((long)local_30 + lVar2) != (FILE *)0x0) {
      setvbuf(*(FILE **)((long)local_30 + lVar2),(char *)0x0,2,0x2000);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void Streams::setup_comm_channels()
  {
#ifdef __USING_WINDOWS__
    util::configure_pipe(&this->g_hChildStd_IN_Rd, &this->g_hChildStd_IN_Wr, &this->g_hChildStd_IN_Wr);
    this->input(util::file_from_handle(this->g_hChildStd_IN_Wr, "w"));
    this->write_to_child_ = _fileno(this->input());

    util::configure_pipe(&this->g_hChildStd_OUT_Rd, &this->g_hChildStd_OUT_Wr, &this->g_hChildStd_OUT_Rd);
    this->output(util::file_from_handle(this->g_hChildStd_OUT_Rd, "r"));
    this->read_from_child_ = _fileno(this->output());

    util::configure_pipe(&this->g_hChildStd_ERR_Rd, &this->g_hChildStd_ERR_Wr, &this->g_hChildStd_ERR_Rd);
    this->error(util::file_from_handle(this->g_hChildStd_ERR_Rd, "r"));
    this->err_read_ = _fileno(this->error());
#else

    if (write_to_child_ != -1)  input(fdopen(write_to_child_, "wb"));
    if (read_from_child_ != -1) output(fdopen(read_from_child_, "rb"));
    if (err_read_ != -1)        error(fdopen(err_read_, "rb"));

    auto handles = {input(), output(), error()};

    for (auto& h : handles) {
      if (h == nullptr) continue;
      setvbuf(h, nullptr, _IONBF, BUFSIZ);
    }
  #endif
  }